

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

int mi_reserve_huge_os_pages_interleave(size_t pages,size_t numa_nodes,size_t timeout_msecs)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t numa_node;
  ulong uVar6;
  size_t timeout_msecs_00;
  ulong pages_00;
  
  if (pages == 0) {
    return 0;
  }
  if ((numa_nodes == 0) && (numa_nodes = _mi_numa_node_count, _mi_numa_node_count == 0)) {
    numa_nodes = _mi_os_numa_node_count_get();
  }
  uVar3 = numa_nodes + (numa_nodes == 0);
  timeout_msecs_00 = 0;
  if (timeout_msecs != 0) {
    timeout_msecs_00 = timeout_msecs / uVar3 + 0x32;
  }
  uVar6 = 0;
  sVar5 = pages;
  while( true ) {
    pages_00 = pages / uVar3 + (ulong)(uVar6 < pages % uVar3);
    iVar2 = mi_reserve_huge_os_pages_at_ex
                      (pages_00,(int)uVar6,timeout_msecs_00,false,(mi_arena_id_t *)0x0);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar4 = 0;
    if (pages_00 <= sVar5) {
      uVar4 = sVar5 - pages_00;
    }
    uVar6 = uVar6 + 1;
    if (numa_nodes <= uVar6) break;
    bVar1 = sVar5 <= pages_00;
    sVar5 = uVar4;
    if (bVar1) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int mi_reserve_huge_os_pages_interleave(size_t pages, size_t numa_nodes, size_t timeout_msecs) mi_attr_noexcept {
  if (pages == 0) return 0;

  // pages per numa node
  size_t numa_count = (numa_nodes > 0 ? numa_nodes : _mi_os_numa_node_count());
  if (numa_count <= 0) numa_count = 1;
  const size_t pages_per = pages / numa_count;
  const size_t pages_mod = pages % numa_count;
  const size_t timeout_per = (timeout_msecs==0 ? 0 : (timeout_msecs / numa_count) + 50);

  // reserve evenly among numa nodes
  for (size_t numa_node = 0; numa_node < numa_count && pages > 0; numa_node++) {
    size_t node_pages = pages_per;  // can be 0
    if (numa_node < pages_mod) node_pages++;
    int err = mi_reserve_huge_os_pages_at(node_pages, (int)numa_node, timeout_per);
    if (err) return err;
    if (pages < node_pages) {
      pages = 0;
    }
    else {
      pages -= node_pages;
    }
  }

  return 0;
}